

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeotriangle.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZGeoTriangle::Jacobian
          (TPZGeoTriangle *this,TPZFMatrix<double> *coord,TPZVec<double> *param,
          TPZFMatrix<double> *jacobian,TPZFMatrix<double> *axes,REAL *detjac,
          TPZFMatrix<double> *jacinv)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int64_t iVar4;
  double *pdVar5;
  long *in_RCX;
  TPZBaseMatrix *in_RSI;
  long *in_R8;
  double *in_R9;
  TPZFMatrix<double> *extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  REAL RVar6;
  double dVar7;
  _func_int **row;
  long *in_stack_00000008;
  int j_1;
  int i_1;
  REAL maxjac;
  int j;
  int i;
  TPZFNMatrix<6,_double> VecMatrix;
  TPZFNMatrix<6,_double> axest;
  TPZFNMatrix<6,_double> dphi;
  TPZFNMatrix<3,_double> phi;
  int spacedim;
  TPZFMatrix<double> *in_stack_fffffffffffffb78;
  TPZVec<double> *in_stack_fffffffffffffb80;
  int64_t in_stack_fffffffffffffb90;
  int64_t in_stack_fffffffffffffb98;
  TPZFNMatrix<6,_double> *in_stack_fffffffffffffba0;
  double *in_stack_fffffffffffffba8;
  int64_t in_stack_fffffffffffffbb0;
  TPZMatrix<double> *in_stack_fffffffffffffbb8;
  TPZFNMatrix<6,_double> *in_stack_fffffffffffffbc0;
  TPZFMatrix<double> *in_stack_fffffffffffffc70;
  TPZFMatrix<double> *pTVar8;
  TPZFMatrix<double> *this_00;
  double local_378;
  int local_370;
  int local_36c;
  double local_368;
  int local_360;
  int local_35c;
  undefined8 local_358;
  int local_34;
  double *local_30;
  long *local_28;
  long *local_20;
  TPZBaseMatrix *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  iVar4 = TPZBaseMatrix::Rows(in_RSI);
  local_34 = (int)iVar4;
  pTVar8 = (TPZFMatrix<double> *)0x2;
  (**(code **)(*local_20 + 0x68))(local_20,2);
  this_00 = (TPZFMatrix<double> *)0x3;
  (**(code **)(*local_28 + 0x68))(local_28,pTVar8);
  (**(code **)(*in_stack_00000008 + 0x68))(in_stack_00000008,pTVar8);
  TPZFNMatrix<3,_double>::TPZFNMatrix
            ((TPZFNMatrix<3,_double> *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             in_stack_fffffffffffffb90);
  TPZFNMatrix<6,_double>::TPZFNMatrix
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  TPZFNMatrix<6,_double>::TPZFNMatrix
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  (**(code **)(*local_20 + 0x78))();
  pztopology::TPZTriangle::Shape
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,(TPZFMatrix<double> *)0x1637dc8);
  local_358 = 0;
  TPZFNMatrix<6,_double>::TPZFNMatrix
            (in_stack_fffffffffffffbc0,(int64_t)in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             in_stack_fffffffffffffba8);
  for (local_35c = 0; local_35c < 3; local_35c = local_35c + 1) {
    for (local_360 = 0; local_360 < local_34; local_360 = local_360 + 1) {
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])
                (local_10,(long)local_360,(long)local_35c);
      in_stack_fffffffffffffc70 = extraout_XMM0_Qa;
      pdVar5 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffba0->super_TPZFMatrix<double>,
                          in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      dVar7 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffba0->super_TPZFMatrix<double>,
                          in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      *pdVar5 = (double)in_stack_fffffffffffffc70 * dVar7 + *pdVar5;
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])
                (local_10,(long)local_360,(long)local_35c);
      pdVar5 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffba0->super_TPZFMatrix<double>,
                          in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      dVar7 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffba0->super_TPZFMatrix<double>,
                          in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      *pdVar5 = extraout_XMM0_Qa_00 * dVar7 + *pdVar5;
    }
  }
  TPZFMatrix<double>::GramSchmidt(this_00,pTVar8,in_stack_fffffffffffffc70);
  TPZFMatrix<double>::Transpose
            (&in_stack_fffffffffffffbc0->super_TPZFMatrix<double>,in_stack_fffffffffffffbb8);
  pdVar5 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffba0->super_TPZFMatrix<double>,in_stack_fffffffffffffb98
                      ,in_stack_fffffffffffffb90);
  dVar7 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffba0->super_TPZFMatrix<double>,in_stack_fffffffffffffb98
                      ,in_stack_fffffffffffffb90);
  dVar1 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffba0->super_TPZFMatrix<double>,in_stack_fffffffffffffb98
                      ,in_stack_fffffffffffffb90);
  dVar2 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffba0->super_TPZFMatrix<double>,in_stack_fffffffffffffb98
                      ,in_stack_fffffffffffffb90);
  *local_30 = dVar7 * dVar1 + -(dVar2 * *pdVar5);
  local_368 = 0.0;
  for (local_36c = 0; local_36c < 2; local_36c = local_36c + 1) {
    for (local_370 = 0; local_370 < 2; local_370 = local_370 + 1) {
      pdVar5 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffba0->super_TPZFMatrix<double>,
                          in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      local_378 = ABS(*pdVar5);
      pdVar5 = Max<double>(&local_368,&local_378);
      local_368 = *pdVar5;
    }
  }
  bVar3 = IsZero(local_368);
  if ((bVar3) || (bVar3 = IsZero(*local_30 / (local_368 * local_368)), bVar3)) {
    RVar6 = ZeroTolerance();
    *local_30 = RVar6;
  }
  pdVar5 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffba0->super_TPZFMatrix<double>,in_stack_fffffffffffffb98
                      ,in_stack_fffffffffffffb90);
  dVar7 = *pdVar5;
  dVar1 = *local_30;
  pdVar5 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffba0->super_TPZFMatrix<double>,in_stack_fffffffffffffb98
                      ,in_stack_fffffffffffffb90);
  *pdVar5 = dVar7 / dVar1;
  pdVar5 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffba0->super_TPZFMatrix<double>,in_stack_fffffffffffffb98
                      ,in_stack_fffffffffffffb90);
  dVar7 = *pdVar5 / *local_30;
  pdVar5 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffba0->super_TPZFMatrix<double>,in_stack_fffffffffffffb98
                      ,in_stack_fffffffffffffb90);
  *pdVar5 = dVar7;
  pdVar5 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffba0->super_TPZFMatrix<double>,in_stack_fffffffffffffb98
                      ,in_stack_fffffffffffffb90);
  row = (_func_int **)(-*pdVar5 / *local_30);
  pTVar8 = (TPZFMatrix<double> *)
           TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffba0->super_TPZFMatrix<double>,(int64_t)row,
                      in_stack_fffffffffffffb90);
  (pTVar8->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = row;
  pdVar5 = TPZFMatrix<double>::operator()(pTVar8,(int64_t)row,in_stack_fffffffffffffb90);
  dVar7 = -*pdVar5 / *local_30;
  pdVar5 = TPZFMatrix<double>::operator()(pTVar8,(int64_t)row,(int64_t)pdVar5);
  *pdVar5 = dVar7;
  TPZFNMatrix<6,_double>::~TPZFNMatrix((TPZFNMatrix<6,_double> *)0x1638489);
  TPZFNMatrix<6,_double>::~TPZFNMatrix((TPZFNMatrix<6,_double> *)0x1638496);
  TPZFNMatrix<6,_double>::~TPZFNMatrix((TPZFNMatrix<6,_double> *)0x16384a3);
  TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x16384b0);
  return;
}

Assistant:

void TPZGeoTriangle::Jacobian(const TPZFMatrix<REAL> & coord, TPZVec<REAL> &param,TPZFMatrix<REAL> &jacobian,TPZFMatrix<REAL> &axes,REAL &detjac,TPZFMatrix<REAL> &jacinv){
		
        int spacedim = coord.Rows();
        jacobian.Resize(2,2); axes.Resize(2,3); jacinv.Resize(2,2);
		TPZFNMatrix<3> phi(3,1);
        TPZFNMatrix<6> dphi(2,3),axest(3,2);
		jacobian.Zero();
		Shape(param,phi,dphi);
        TPZFNMatrix<6> VecMatrix(3,2,0.);
        for(int i = 0; i < 3; i++) {
			for(int j = 0; j < spacedim; j++) {
				VecMatrix(j,0) += coord.GetVal(j,i)*dphi(0,i);
				VecMatrix(j,1) += coord.GetVal(j,i)*dphi(1,i);
			}
        }
        VecMatrix.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
		detjac = jacobian(0,0)*jacobian(1,1)-jacobian(1,0)*jacobian(0,1);
    REAL maxjac = 0.;
    for (int i=0; i<2; i++) {
      for (int j=0; j<2; j++) {
        maxjac = Max(maxjac,fabs(jacobian(i,j)));
      }
    }
        if(IsZero(maxjac) || IsZero(detjac/(maxjac*maxjac)))
		{
#ifdef PZDEBUG
			std::stringstream sout;
			sout << "Singular Jacobian " << detjac;
			LOGPZ_ERROR(logger, sout.str())
#endif
			detjac = ZeroTolerance();
		}
        
        jacinv(0,0) =  jacobian(1,1)/detjac;
        jacinv(1,1) =  jacobian(0,0)/detjac;
        jacinv(0,1) = -jacobian(0,1)/detjac;
        jacinv(1,0) = -jacobian(1,0)/detjac;
	}